

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::Columns(int columns_count,char *id,bool border)

{
  ImGuiOldColumns *pIVar1;
  ImGuiContext *pIVar2;
  
  pIVar2 = GImGui;
  GImGui->CurrentWindow->WriteAccessed = true;
  pIVar1 = (pIVar2->CurrentWindow->DC).CurrentColumns;
  if (pIVar1 != (ImGuiOldColumns *)0x0) {
    if ((pIVar1->Count == columns_count) && (pIVar1->Flags == (uint)!border)) {
      return;
    }
    EndColumns();
  }
  if (columns_count == 1) {
    return;
  }
  BeginColumns(id,columns_count,(uint)!border);
  return;
}

Assistant:

void ImGui::Columns(int columns_count, const char* id, bool border)
{
    ImGuiWindow* window = GetCurrentWindow();
    IM_ASSERT(columns_count >= 1);

    ImGuiOldColumnFlags flags = (border ? 0 : ImGuiOldColumnFlags_NoBorder);
    //flags |= ImGuiOldColumnFlags_NoPreserveWidths; // NB: Legacy behavior
    ImGuiOldColumns* columns = window->DC.CurrentColumns;
    if (columns != NULL && columns->Count == columns_count && columns->Flags == flags)
        return;

    if (columns != NULL)
        EndColumns();

    if (columns_count != 1)
        BeginColumns(id, columns_count, flags);
}